

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRMiner.cpp
# Opt level: O0

void dgrminer::run_DGRMiner
               (string *input_file,string *output_file,double min_support,double min_confidence,
               bool compute_confidence,int window_size,string *str_timeabstraction,
               bool search_for_anomalies,double min_anomaly_outlierness,bool verbose,
               bool new_measures,bool heuristic_mis)

{
  size_t *this;
  pointer *this_00;
  pointer *ppvVar1;
  pointer *this_01;
  pointer paVar2;
  int max_absolute_support_00;
  byte bVar3;
  int iVar4;
  pointer paVar5;
  reference pvVar6;
  reference pvVar7;
  reference graph_ids;
  double dVar8;
  string local_958 [32];
  PartialUnion local_938;
  undefined1 local_7d0 [8];
  array<int,_10UL> i_p;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> init_pattern;
  size_t j;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> starting_edges;
  size_t i_1;
  PartialUnion local_748;
  size_type local_5e0;
  size_type local_5d8;
  value_type_conflict local_5cc;
  undefined1 local_5c8 [4];
  int i;
  vector<int,_std::allocator<int>_> antecedent_graph_ids;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  initial_patterns_occurrences;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> initial_patterns;
  vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
  adjacency_lists;
  set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  edges_set;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> newedges;
  undefined1 local_4f0 [8];
  set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
  labeled_nodes;
  int min_absolute_support;
  int max_absolute_support;
  int snapshots;
  int local_4ac;
  string local_4a8 [3];
  bool set_of_graphs;
  PartialUnion local_488;
  undefined1 local_310 [8];
  PartialUnion pu;
  undefined1 local_1a0 [6];
  FileReader fr;
  bool debugPrint;
  results_crate_anomalies results_anomalies;
  results_crate results;
  bool simple_node_time_abstraction;
  bool simple_time_abstraction;
  bool heuristic_mis_local;
  bool new_measures_local;
  bool verbose_local;
  double min_anomaly_outlierness_local;
  bool search_for_anomalies_local;
  string *str_timeabstraction_local;
  int window_size_local;
  bool compute_confidence_local;
  double min_confidence_local;
  double min_support_local;
  string *output_file_local;
  string *input_file_local;
  
  results.occurrences_antecedent.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = verbose;
  results.occurrences_antecedent.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = new_measures;
  results.occurrences_antecedent.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = heuristic_mis;
  results.occurrences_antecedent.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ =
       std::operator==(str_timeabstraction,"bin_all");
  results.occurrences_antecedent.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ =
       std::operator==(str_timeabstraction,"bin_nodes");
  results_crate::results_crate
            ((results_crate *)
             &results_anomalies.anomaly_occurrences.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  results_crate_anomalies::results_crate_anomalies((results_crate_anomalies *)local_1a0);
  results_anomalies.anomaly_occurrences.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_1a0._0_4_ = 0;
  pu.rawAdjacencyLists.
  super__Vector_base<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  PartialUnion::PartialUnion((PartialUnion *)local_310);
  debug_println<char[22]>
            ((bool)(results.occurrences_antecedent.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
             (char (*) [22])"--- STARTING DGRMINER");
  debug_print<char[17]>
            ((bool)(results.occurrences_antecedent.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
             (char (*) [17])"--- READING FILE");
  std::__cxx11::string::string(local_4a8,(string *)input_file);
  FileReader::read_dynamic_graph_from_file
            (&local_488,
             (FileReader *)
             ((long)&pu.rawAdjacencyLists.
                     super__Vector_base<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6),(string *)local_4a8,
             window_size,search_for_anomalies);
  PartialUnion::operator=((PartialUnion *)local_310,&local_488);
  PartialUnion::~PartialUnion(&local_488);
  std::__cxx11::string::~string(local_4a8);
  debug_println<char[7]>
            ((bool)(results.occurrences_antecedent.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
             (char (*) [7])0x17c80a);
  PartialUnion::printDimensions((PartialUnion *)local_310);
  bVar3 = results.occurrences_antecedent.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
  local_4ac = PartialUnion::getNumberOfDynamicGraphs((PartialUnion *)local_310);
  debug_println<char[27],int>
            ((bool)(bVar3 & 1),(char (*) [27])"Number of dynamic graphs: ",&local_4ac);
  PartialUnion::setNewMeasuresAndHeuristics
            ((PartialUnion *)local_310,
             (bool)(results.occurrences_antecedent.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1),
             (bool)(results.occurrences_antecedent.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ & 1));
  iVar4 = PartialUnion::getNumberOfDynamicGraphs((PartialUnion *)local_310);
  snapshots._3_1_ = 1 < iVar4;
  iVar4 = PartialUnion::getNumberOfNodes((PartialUnion *)local_310);
  if (iVar4 == 0) {
    debug_println<char[42]>
              ((bool)(results.occurrences_antecedent.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
               (char (*) [42])"The union graph has no nodes! Quitting...");
    max_absolute_support = 1;
  }
  else {
    labeled_nodes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
         PartialUnion::getNumberOfSnapshots((PartialUnion *)local_310);
    min_absolute_support = labeled_nodes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
    if (((snapshots._3_1_ & 1) != 0) &&
       ((results.occurrences_antecedent.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) == 0)) {
      iVar4 = PartialUnion::queryMappingSnapshotsToGraphs
                        ((PartialUnion *)local_310,
                         labeled_nodes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + -1);
      labeled_nodes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = iVar4 + 1;
    }
    min_confidence_local = min_support;
    if ((results.occurrences_antecedent.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) == 0) {
      min_confidence_local =
           (double)labeled_nodes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ *
           min_support;
    }
    dVar8 = ceil(min_confidence_local);
    labeled_nodes._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = (int)dVar8;
    debug_println<char[23],int>
              ((bool)(results.occurrences_antecedent.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
               (char (*) [23])"Max absolute support: ",
               (int *)((long)&labeled_nodes._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
    debug_println<char[22],int>
              ((bool)(results.occurrences_antecedent.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
               (char (*) [22])"Number of snapshots: ",&min_absolute_support);
    debug_println<char[25],int>
              ((bool)(results.occurrences_antecedent.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
               (char (*) [25])"Min support (absolute): ",
               (int *)&labeled_nodes._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if ((results.occurrences_antecedent.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ & 1) == 0) {
      if ((results.occurrences_antecedent.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
        PartialUnion::performSimpleNodeTimeAbstraction((PartialUnion *)local_310);
      }
    }
    else {
      PartialUnion::performSimpleTimeAbstraction((PartialUnion *)local_310);
    }
    if (!compute_confidence) {
      debug_println<char[33]>
                ((bool)(results.occurrences_antecedent.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                 (char (*) [33])"--- REMOVING INFREQUENT VERTICES");
    }
    PartialUnion::computeFrequentVerticesAndRemoveTheInfrequentOnes
              ((PartialUnion *)local_310,
               (int)labeled_nodes._M_t._M_impl.super__Rb_tree_header._M_node_count,min_confidence,
               compute_confidence,
               (results_crate *)
               &results_anomalies.anomaly_occurrences.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (results_crate_anomalies *)local_1a0,
               labeled_nodes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
               (bool)(snapshots._3_1_ & 1),search_for_anomalies,min_anomaly_outlierness);
    if (!compute_confidence) {
      debug_println<char[11]>
                ((bool)(results.occurrences_antecedent.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                 (char (*) [11])"--- (DONE)");
      debug_println<char[27]>
                ((bool)(results.occurrences_antecedent.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                 (char (*) [27])"--- REMOVING INVALID EDGES");
    }
    PartialUnion::compute_labeled_nodes
              ((set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
                *)local_4f0,(PartialUnion *)local_310);
    if (!compute_confidence) {
      std::
      set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
      ::set((set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
             *)&newedges.
                super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
            (set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
             *)local_4f0);
      PartialUnion::eraseInvalidEdges
                ((PartialUnion *)local_310,
                 (set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
                  *)&newedges.
                     super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
      ::~set((set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
              *)&newedges.
                 super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      debug_println<char[11]>
                ((bool)(results.occurrences_antecedent.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                 (char (*) [11])"--- (DONE)");
      debug_println<char[30]>
                ((bool)(results.occurrences_antecedent.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                 (char (*) [30])"--- REMOVING INFREQUENT EDGES");
    }
    this = &edges_set._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
              ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)this);
    this_00 = &adjacency_lists.
               super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
    ::set((set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
           *)this_00);
    PartialUnion::compute_labeled_edges
              ((PartialUnion *)local_310,
               (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)this,
               (set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
                *)this_00,
               (set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
                *)local_4f0,
               (bool)(pu.rawAdjacencyLists.
                      super__Vector_base<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
    if (!compute_confidence) {
      PartialUnion::removeInfrequentEdges
                ((PartialUnion *)local_310,
                 (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                 &edges_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
                  *)&adjacency_lists.
                     super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (int)labeled_nodes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (bool)(snapshots._3_1_ & 1),
                 (bool)(pu.rawAdjacencyLists.
                        super__Vector_base<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
      debug_println<char[11]>
                ((bool)(results.occurrences_antecedent.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                 (char (*) [11])"--- (DONE)");
    }
    debug_print<char[30]>
              ((bool)(results.occurrences_antecedent.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
               (char (*) [30])"--- BUILDING ADJACENCY LISTS ");
    PartialUnion::createAdjacencyLists
              ((vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                *)&initial_patterns.
                   super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,(PartialUnion *)local_310,
               (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
               &edges_set._M_t._M_impl.super__Rb_tree_header._M_node_count,min_absolute_support);
    debug_println<char[7]>
              ((bool)(results.occurrences_antecedent.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
               (char (*) [7])0x17c80a);
    debug_print<char[30]>
              ((bool)(results.occurrences_antecedent.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
               (char (*) [30])"--- GETTING INITIAL PATTERNS ");
    ppvVar1 = &initial_patterns_occurrences.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
              ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)ppvVar1);
    this_01 = &antecedent_graph_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)this_01);
    getFrequentInitialPatterns
              ((set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
                *)&adjacency_lists.
                   super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)ppvVar1,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)this_01,(int)labeled_nodes._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (bool)(snapshots._3_1_ & 1),(PartialUnion *)local_310);
    debug_println<char[7]>
              ((bool)(results.occurrences_antecedent.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
               (char (*) [7])0x17c80a);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_5c8);
    for (local_5cc = 0;
        bVar3 = results.occurrences_antecedent.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_,
        local_5cc < min_absolute_support; local_5cc = local_5cc + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_5c8,&local_5cc);
    }
    local_5d8 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::size
                          ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                           &initial_patterns_occurrences.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    debug_println<char[46],unsigned_long,char[20]>
              ((bool)(bVar3 & 1),(char (*) [46])"--- FINDING FREQUENT PATTERNS (STARTING FROM ",
               &local_5d8,(char (*) [20])" INITIAL PATTERNS):");
    bVar3 = results.occurrences_antecedent.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
    local_5e0 = std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::size
                          ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                           &results);
    debug_println<char[6],unsigned_long,char[39]>
              ((bool)(bVar3 & 1),(char (*) [6])"--- (",&local_5e0,
               (char (*) [39])" SINGLE-VERTEX PATTERNS ALREADY FOUND)");
    PartialUnion::PartialUnion(&local_748,(PartialUnion *)local_310);
    std::__cxx11::string::string((string *)&i_1,(string *)output_file);
    printResultsToFiles((results_crate *)
                        &results_anomalies.anomaly_occurrences.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (results_crate_anomalies *)local_1a0,&local_748,(string *)&i_1,
                        (bool)(snapshots._3_1_ & 1),compute_confidence,search_for_anomalies,false);
    std::__cxx11::string::~string((string *)&i_1);
    PartialUnion::~PartialUnion(&local_748);
    for (starting_edges.
         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        paVar2 = starting_edges.
                 super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,
        paVar5 = (pointer)std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ::size((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                  *)&initial_patterns_occurrences.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage),
        paVar2 < paVar5;
        starting_edges.
        super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)(starting_edges.
                              super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_elems + 1)) {
      std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
                ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)&j);
      for (init_pattern.
           super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          init_pattern.
          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage <=
          starting_edges.
          super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
          init_pattern.
          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)(init_pattern.
                                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_elems + 1))
      {
        pvVar6 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::
                 operator[]((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                            &initial_patterns_occurrences.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (size_type)
                            init_pattern.
                            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::push_back
                  ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)&j,pvVar6
                  );
      }
      std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::vector
                ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                 (i_p._M_elems + 8));
      local_7d0._0_4_ = 0;
      local_7d0._4_4_ = 1;
      ppvVar1 = &initial_patterns_occurrences.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar6 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::operator[]
                         ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                          ppvVar1,(size_type)
                                  starting_edges.
                                  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar7 = std::array<int,_8UL>::operator[](pvVar6,0);
      i_p._M_elems[0] = *pvVar7;
      pvVar6 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::operator[]
                         ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                          ppvVar1,(size_type)
                                  starting_edges.
                                  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar7 = std::array<int,_8UL>::operator[](pvVar6,1);
      i_p._M_elems[1] = *pvVar7;
      pvVar6 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::operator[]
                         ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                          ppvVar1,(size_type)
                                  starting_edges.
                                  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar7 = std::array<int,_8UL>::operator[](pvVar6,2);
      i_p._M_elems[2] = *pvVar7;
      pvVar6 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::operator[]
                         ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                          ppvVar1,(size_type)
                                  starting_edges.
                                  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar7 = std::array<int,_8UL>::operator[](pvVar6,3);
      i_p._M_elems[3] = *pvVar7;
      pvVar6 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::operator[]
                         ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                          ppvVar1,(size_type)
                                  starting_edges.
                                  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar7 = std::array<int,_8UL>::operator[](pvVar6,4);
      i_p._M_elems[4] = *pvVar7;
      pvVar6 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::operator[]
                         ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                          ppvVar1,(size_type)
                                  starting_edges.
                                  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar7 = std::array<int,_8UL>::operator[](pvVar6,5);
      i_p._M_elems[5] = *pvVar7;
      pvVar6 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::operator[]
                         ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                          ppvVar1,(size_type)
                                  starting_edges.
                                  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar7 = std::array<int,_8UL>::operator[](pvVar6,6);
      i_p._M_elems[6] = *pvVar7;
      pvVar6 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::operator[]
                         ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                          ppvVar1,(size_type)
                                  starting_edges.
                                  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar7 = std::array<int,_8UL>::operator[](pvVar6,7);
      i_p._M_elems[7] = *pvVar7;
      std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::push_back
                ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                 (i_p._M_elems + 8),(value_type *)local_7d0);
      graph_ids = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                *)&antecedent_graph_ids.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage,
                               (size_type)
                               starting_edges.
                               super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      max_absolute_support_00 = labeled_nodes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_
      ;
      iVar4 = (int)labeled_nodes._M_t._M_impl.super__Rb_tree_header._M_node_count;
      PartialUnion::PartialUnion(&local_938,(PartialUnion *)local_310);
      bVar3 = snapshots._3_1_;
      std::__cxx11::string::string(local_958,(string *)output_file);
      DGRSubgraphMining((vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                         *)&initial_patterns.
                            super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,graph_ids,
                        (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                        (i_p._M_elems + 8),iVar4,
                        (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)&j,
                        (results_crate *)
                        &results_anomalies.anomaly_occurrences.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (results_crate_anomalies *)local_1a0,max_absolute_support_00,min_confidence,
                        compute_confidence,&local_938,(vector<int,_std::allocator<int>_> *)local_5c8
                        ,(bool)(bVar3 & 1),search_for_anomalies,min_anomaly_outlierness,
                        (string *)local_958,
                        (bool)(results.occurrences_antecedent.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                        (bool)(results.occurrences_antecedent.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1),
                        (bool)(results.occurrences_antecedent.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ & 1));
      std::__cxx11::string::~string(local_958);
      PartialUnion::~PartialUnion(&local_938);
      std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::~vector
                ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                 (i_p._M_elems + 8));
      std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~vector
                ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)&j);
    }
    debug_println<char[10]>
              ((bool)(results.occurrences_antecedent.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
               (char (*) [10])"FINISHED.");
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_5c8);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&antecedent_graph_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~vector
              ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
               &initial_patterns_occurrences.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>::
    ~vector((vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_> *)
            &initial_patterns.
             super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
    ::~set((set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
            *)&adjacency_lists.
               super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~vector
              ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
               &edges_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
    ::~set((set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
            *)local_4f0);
    max_absolute_support = 0;
  }
  PartialUnion::~PartialUnion((PartialUnion *)local_310);
  results_crate_anomalies::~results_crate_anomalies((results_crate_anomalies *)local_1a0);
  results_crate::~results_crate
            ((results_crate *)
             &results_anomalies.anomaly_occurrences.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void run_DGRMiner(std::string input_file, std::string output_file, double min_support, double min_confidence,
					  bool compute_confidence, int window_size, std::string str_timeabstraction,
					  bool search_for_anomalies, double min_anomaly_outlierness, bool verbose, bool new_measures, bool heuristic_mis)
	{
		// set abstractions appropriately
		bool simple_time_abstraction = (str_timeabstraction == "bin_all");
		bool simple_node_time_abstraction = (str_timeabstraction == "bin_nodes");

		// save result patterns in the results_crate
		results_crate results;
		results_crate_anomalies results_anomalies;
		results.saved_instances = 0;
		results_anomalies.anomaly_saved_instances = 0;

		bool debugPrint = true;


		FileReader fr;
		PartialUnion pu;

		debug_println(verbose, "--- STARTING DGRMINER");
		debug_print(verbose, "--- READING FILE");
		pu = fr.read_dynamic_graph_from_file(input_file, window_size, search_for_anomalies);
		debug_println(verbose, "(DONE)");
		pu.printDimensions();
		debug_println(verbose, "Number of dynamic graphs: ", pu.getNumberOfDynamicGraphs());

	  	pu.setNewMeasuresAndHeuristics(new_measures, heuristic_mis);

		bool set_of_graphs = pu.getNumberOfDynamicGraphs() > 1;

		if (pu.getNumberOfNodes() == 0)
		{
			debug_println(verbose, "The union graph has no nodes! Quitting...");
			return;
		}

		int snapshots = pu.getNumberOfSnapshots();
		int max_absolute_support = snapshots;
		if (set_of_graphs && !new_measures) {
			max_absolute_support = pu.queryMappingSnapshotsToGraphs(snapshots - 1) + 1;
		}

	  	if (!new_measures) {
		  	min_support = max_absolute_support * min_support;
		}

	  	// what is the minimum support expressed by an absolute value
		auto min_absolute_support = (int) ceil(min_support);

		debug_println(verbose, "Max absolute support: ", max_absolute_support);
		debug_println(verbose, "Number of snapshots: ", snapshots);
		debug_println(verbose, "Min support (absolute): ", min_absolute_support);

		if (simple_time_abstraction)
		{
			pu.performSimpleTimeAbstraction();
		}
		else if (simple_node_time_abstraction)
		{
			pu.performSimpleNodeTimeAbstraction();
		}

		// we cannot remove infrequent vertices and edges if we are computing confidence (= if we are computing antecedents!!!! - also when computing anomalies)
		if (!compute_confidence)
		{
			debug_println(verbose, "--- REMOVING INFREQUENT VERTICES");
		}

		// compute the frequent vertices and remove the infrequent ones,
        // save the frequent ones into results
		pu.computeFrequentVerticesAndRemoveTheInfrequentOnes(min_absolute_support, min_confidence, compute_confidence,
															 &results, &results_anomalies, max_absolute_support,
															 set_of_graphs,
															 search_for_anomalies, min_anomaly_outlierness);
		if (!compute_confidence)
		{
			debug_println(verbose, "--- (DONE)");
			debug_println(verbose, "--- REMOVING INVALID EDGES");
		}


		std::set<labeled_node_time> labeled_nodes = pu.compute_labeled_nodes();
		if (!compute_confidence)
		{
			pu.eraseInvalidEdges(labeled_nodes);
			debug_println(verbose, "--- (DONE)");

			// remove infrequent edges
			debug_println(verbose, "--- REMOVING INFREQUENT EDGES");
		}

		std::vector<std::array<int, 8>> newedges;  // will be used for adjacency info
		std::set<labeled_edge_with_occurrences> edges_set; // this contains edges flipped to be smaller, used for counting support of the edges
		pu.compute_labeled_edges(newedges, edges_set, labeled_nodes, debugPrint); // computes newedges, edges_set

		if (!compute_confidence)
		{
			pu.removeInfrequentEdges(newedges, edges_set, min_absolute_support, set_of_graphs, debugPrint);
			debug_println(verbose, "--- (DONE)");
		}

		// build adjacency lists (one list for each snapshot):
		debug_print(verbose, "--- BUILDING ADJACENCY LISTS ");
		std::vector<AdjacencyListCrate> adjacency_lists = pu.createAdjacencyLists(newedges, snapshots);
		debug_println(verbose, "(DONE)");


		// create initial patterns:
		debug_print(verbose, "--- GETTING INITIAL PATTERNS ");
		std::vector<std::array<int, 8>> initial_patterns;
		std::vector<std::vector<int>> initial_patterns_occurrences;
		getFrequentInitialPatterns(edges_set, initial_patterns, initial_patterns_occurrences, min_absolute_support,
								   set_of_graphs, pu); // fills initial_patterns, initial_patterns_occurrences
		debug_println(verbose, "(DONE)");


		vector<int> antecedent_graph_ids;
		for (int i = 0; i < snapshots; i++)
		{
			antecedent_graph_ids.push_back(i);

		}

		debug_println(verbose, "--- FINDING FREQUENT PATTERNS (STARTING FROM ", initial_patterns.size(),
					  " INITIAL PATTERNS):");
		debug_println(verbose, "--- (", results.result_nodes.size(), " SINGLE-VERTEX PATTERNS ALREADY FOUND)");

		printResultsToFiles(&results, &results_anomalies, pu, output_file, set_of_graphs, compute_confidence,
							search_for_anomalies, false);


		for (size_t i = 0; i < initial_patterns.size(); i++)
		{
			std::vector<std::array<int, 8>> starting_edges;
			for (size_t j = 0; j <= i; j++)
			{
				starting_edges.push_back(initial_patterns[j]);
			}
			std::vector<std::array<int, 10>> init_pattern;
			std::array<int, 10> i_p = {
					0,
					1,
					initial_patterns[i][0],
					initial_patterns[i][1],
					initial_patterns[i][2],
					initial_patterns[i][3],
					initial_patterns[i][4],
					initial_patterns[i][5],
					initial_patterns[i][6],
					initial_patterns[i][7]
			};

			init_pattern.push_back(i_p);

			DGRSubgraphMining(adjacency_lists, initial_patterns_occurrences[i], init_pattern, min_absolute_support,
							  starting_edges, &results, &results_anomalies,
							  max_absolute_support, min_confidence, compute_confidence, pu, antecedent_graph_ids,
							  set_of_graphs, search_for_anomalies, min_anomaly_outlierness, output_file, verbose, new_measures,
							  heuristic_mis);
		}

		debug_println(verbose, "FINISHED.");
	}